

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

uint8_t * __thiscall
CoreML::Specification::ScaleLayerParams::_InternalSerialize
          (ScaleLayerParams *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  uint uVar1;
  unsigned_long uVar2;
  bool bVar3;
  int iVar4;
  RepeatedField<unsigned_long> *this_00;
  unsigned_long *puVar5;
  byte *pbVar6;
  uint64_t uVar7;
  uint8_t *puVar8;
  LogMessage *pLVar9;
  WeightParams *pWVar10;
  void *data;
  unsigned_long *puVar11;
  int byte_size_1;
  int byte_size;
  uint32_t cached_has_bits;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  ScaleLayerParams *this_local;
  memory_order __b_1;
  memory_order __b;
  unsigned_long *end;
  unsigned_long *it;
  EpsCopyOutputStream *local_1f0;
  EpsCopyOutputStream *local_1c8;
  ulong local_1c0;
  EpsCopyOutputStream *local_1b8;
  LogFinisher local_195 [20];
  byte local_181;
  LogMessage local_180;
  byte *local_148;
  uint local_140;
  int local_13c;
  EpsCopyOutputStream *local_138;
  byte *local_130;
  uint local_124;
  byte *local_120;
  EpsCopyOutputStream *local_118;
  uint local_10c;
  unsigned_long *local_108;
  unsigned_long *end_1;
  unsigned_long *it_1;
  EpsCopyOutputStream *local_f0;
  uint local_e4;
  RepeatedField<unsigned_long> *local_e0;
  int local_d4;
  EpsCopyOutputStream *local_d0;
  EpsCopyOutputStream *local_c8;
  ulong local_c0;
  EpsCopyOutputStream *local_b8;
  byte *local_b0;
  uint local_a8;
  int local_a4;
  EpsCopyOutputStream *local_a0;
  LogFinisher local_95 [20];
  byte local_81;
  LogMessage local_80;
  byte *local_48;
  uint local_40;
  int local_3c;
  EpsCopyOutputStream *local_38;
  byte *local_30;
  uint local_24;
  byte *local_20;
  EpsCopyOutputStream *local_18;
  uint local_c;
  
  std::operator&(memory_order_relaxed,__memory_order_mask);
  uVar1 = (this->_shapescale_cached_byte_size_).super___atomic_base<int>._M_i;
  stream_local = (EpsCopyOutputStream *)target;
  if (0 < (int)uVar1) {
    this_00 = _internal_shapescale(this);
    local_148 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    local_13c = 1;
    local_140 = 2;
    local_181 = 0;
    local_138 = stream;
    if (stream->end_ <= local_148) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_180,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x36d);
      local_181 = 1;
      pLVar9 = google::protobuf::internal::LogMessage::operator<<
                         (&local_180,"CHECK failed: ptr < end_: ");
      google::protobuf::internal::LogFinisher::operator=(local_195,pLVar9);
    }
    if ((local_181 & 1) != 0) {
      google::protobuf::internal::LogMessage::~LogMessage(&local_180);
    }
    local_124 = local_13c << 3 | local_140;
    local_130 = local_148;
    *local_148 = (byte)local_124;
    if (local_124 < 0x80) {
      local_120 = local_148 + 1;
    }
    else {
      *local_148 = *local_148 | 0x80;
      local_124 = local_124 >> 7;
      local_148[1] = (byte)local_124;
      if (local_124 < 0x80) {
        local_120 = local_148 + 2;
      }
      else {
        local_130 = local_148 + 2;
        do {
          local_130[-1] = local_130[-1] | 0x80;
          local_124 = local_124 >> 7;
          *local_130 = (byte)local_124;
          local_130 = local_130 + 1;
          local_120 = local_130;
        } while (0x7f < local_124);
      }
    }
    local_118 = (EpsCopyOutputStream *)local_120;
    for (local_10c = uVar1; 0x7f < local_10c; local_10c = local_10c >> 7) {
      *(byte *)local_118 = (byte)local_10c | 0x80;
      local_118 = (EpsCopyOutputStream *)((long)local_118 + 1);
    }
    local_1f0 = (EpsCopyOutputStream *)((long)local_118 + 1);
    *(byte *)local_118 = (byte)local_10c;
    local_118 = local_1f0;
    puVar5 = google::protobuf::RepeatedField<unsigned_long>::data(this_00);
    iVar4 = google::protobuf::RepeatedField<unsigned_long>::size(this_00);
    end = puVar5;
    do {
      pbVar6 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)local_1f0);
      puVar11 = end + 1;
      uVar7 = google::protobuf::io::EpsCopyOutputStream::Encode64(*end);
      *pbVar6 = (byte)uVar7;
      if (uVar7 < 0x80) {
        local_1b8 = (EpsCopyOutputStream *)(pbVar6 + 1);
      }
      else {
        *pbVar6 = *pbVar6 | 0x80;
        local_1c0 = uVar7 >> 7;
        pbVar6[1] = (byte)local_1c0;
        if (local_1c0 < 0x80) {
          local_1b8 = (EpsCopyOutputStream *)(pbVar6 + 2);
        }
        else {
          local_1c8 = (EpsCopyOutputStream *)(pbVar6 + 2);
          do {
            local_1c8[-1].field_0x3f = local_1c8[-1].field_0x3f | 0x80;
            local_1c0 = local_1c0 >> 7;
            *(byte *)&local_1c8->end_ = (byte)local_1c0;
            local_1c8 = (EpsCopyOutputStream *)((long)&local_1c8->end_ + 1);
            local_1b8 = local_1c8;
          } while (0x7f < local_1c0);
        }
      }
      local_1f0 = local_1b8;
      end = puVar11;
    } while (puVar11 < puVar5 + iVar4);
    stream_local = local_1b8;
  }
  bVar3 = _internal_has_scale(this);
  if (bVar3) {
    puVar8 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    pWVar10 = _Internal::scale(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::
                   InternalWriteMessage<CoreML::Specification::WeightParams>
                             (2,pWVar10,puVar8,stream);
  }
  bVar3 = _internal_hasbias(this);
  if (bVar3) {
    puVar8 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    bVar3 = _internal_hasbias(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteBoolToArray(3,bVar3,puVar8);
  }
  std::operator&(memory_order_relaxed,__memory_order_mask);
  uVar1 = (this->_shapebias_cached_byte_size_).super___atomic_base<int>._M_i;
  if (0 < (int)uVar1) {
    local_e0 = _internal_shapebias(this);
    local_d4 = 4;
    local_f0 = stream_local;
    it_1 = (unsigned_long *)google::protobuf::io::EpsCopyOutputStream::Encode64;
    local_e4 = uVar1;
    local_d0 = stream;
    local_f0 = (EpsCopyOutputStream *)
               google::protobuf::io::EpsCopyOutputStream::EnsureSpace
                         (stream,(uint8_t *)stream_local);
    local_a4 = local_d4;
    local_a8 = local_e4;
    local_3c = local_d4;
    local_40 = 2;
    local_81 = 0;
    local_b0 = (byte *)local_f0;
    local_a0 = stream;
    local_48 = (byte *)local_f0;
    local_38 = stream;
    if (stream->end_ <= local_f0) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_80,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x36d);
      local_81 = 1;
      pLVar9 = google::protobuf::internal::LogMessage::operator<<
                         (&local_80,"CHECK failed: ptr < end_: ");
      google::protobuf::internal::LogFinisher::operator=(local_95,pLVar9);
    }
    if ((local_81 & 1) != 0) {
      google::protobuf::internal::LogMessage::~LogMessage(&local_80);
    }
    local_24 = local_3c << 3 | local_40;
    local_30 = local_48;
    *local_48 = (byte)local_24;
    if (local_24 < 0x80) {
      local_20 = local_48 + 1;
    }
    else {
      *local_48 = *local_48 | 0x80;
      local_24 = local_24 >> 7;
      local_48[1] = (byte)local_24;
      if (local_24 < 0x80) {
        local_20 = local_48 + 2;
      }
      else {
        local_30 = local_48 + 2;
        do {
          local_30[-1] = local_30[-1] | 0x80;
          local_24 = local_24 >> 7;
          *local_30 = (byte)local_24;
          local_30 = local_30 + 1;
          local_20 = local_30;
        } while (0x7f < local_24);
      }
    }
    local_b0 = local_20;
    local_18 = (EpsCopyOutputStream *)local_20;
    for (local_c = local_a8; 0x7f < local_c; local_c = local_c >> 7) {
      *(byte *)local_18 = (byte)local_c | 0x80;
      local_18 = (EpsCopyOutputStream *)((long)local_18 + 1);
    }
    local_f0 = (EpsCopyOutputStream *)((long)local_18 + 1);
    *(byte *)local_18 = (byte)local_c;
    local_18 = local_f0;
    puVar5 = google::protobuf::RepeatedField<unsigned_long>::data(local_e0);
    end_1 = puVar5;
    iVar4 = google::protobuf::RepeatedField<unsigned_long>::size(local_e0);
    local_108 = puVar5 + iVar4;
    do {
      local_f0 = (EpsCopyOutputStream *)
                 google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)local_f0);
      uVar2 = *end_1;
      end_1 = end_1 + 1;
      local_c0 = (*(code *)it_1)(uVar2);
      local_c8 = local_f0;
      *(byte *)&local_f0->end_ = (byte)local_c0;
      if (local_c0 < 0x80) {
        local_b8 = (EpsCopyOutputStream *)((long)&local_f0->end_ + 1);
      }
      else {
        *(byte *)&local_f0->end_ = *(byte *)&local_f0->end_ | 0x80;
        local_c0 = local_c0 >> 7;
        *(byte *)((long)&local_f0->end_ + 1) = (byte)local_c0;
        if (local_c0 < 0x80) {
          local_b8 = (EpsCopyOutputStream *)((long)&local_f0->end_ + 2);
        }
        else {
          local_c8 = (EpsCopyOutputStream *)((long)&local_f0->end_ + 2);
          do {
            local_c8[-1].field_0x3f = local_c8[-1].field_0x3f | 0x80;
            local_c0 = local_c0 >> 7;
            *(byte *)&local_c8->end_ = (byte)local_c0;
            local_c8 = (EpsCopyOutputStream *)((long)&local_c8->end_ + 1);
            local_b8 = local_c8;
          } while (0x7f < local_c0);
        }
      }
      local_f0 = local_b8;
    } while (end_1 < local_108);
    stream_local = local_b8;
  }
  bVar3 = _internal_has_bias(this);
  if (bVar3) {
    puVar8 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    pWVar10 = _Internal::bias(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::
                   InternalWriteMessage<CoreML::Specification::WeightParams>
                             (5,pWVar10,puVar8,stream);
  }
  bVar3 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_MessageLite)._internal_metadata_);
  if (bVar3) {
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    data = (void *)std::__cxx11::string::data();
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    iVar4 = std::__cxx11::string::size();
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteRaw
                             (stream,data,iVar4,(uint8_t *)stream_local);
  }
  return (uint8_t *)stream_local;
}

Assistant:

uint8_t* ScaleLayerParams::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.ScaleLayerParams)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated uint64 shapeScale = 1;
  {
    int byte_size = _shapescale_cached_byte_size_.load(std::memory_order_relaxed);
    if (byte_size > 0) {
      target = stream->WriteUInt64Packed(
          1, _internal_shapescale(), byte_size, target);
    }
  }

  // .CoreML.Specification.WeightParams scale = 2;
  if (this->_internal_has_scale()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        2, _Internal::scale(this), target, stream);
  }

  // bool hasBias = 3;
  if (this->_internal_hasbias() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteBoolToArray(3, this->_internal_hasbias(), target);
  }

  // repeated uint64 shapeBias = 4;
  {
    int byte_size = _shapebias_cached_byte_size_.load(std::memory_order_relaxed);
    if (byte_size > 0) {
      target = stream->WriteUInt64Packed(
          4, _internal_shapebias(), byte_size, target);
    }
  }

  // .CoreML.Specification.WeightParams bias = 5;
  if (this->_internal_has_bias()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        5, _Internal::bias(this), target, stream);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.ScaleLayerParams)
  return target;
}